

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O1

void __thiscall
tcmalloc::ThreadCache::ReleaseToCentralCache(ThreadCache *this,FreeList *src,uint32_t cl,int N)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  uint N_00;
  
  if ((ulong)src->length_ < (ulong)(long)N) {
    N = src->length_;
  }
  uVar5 = (ulong)cl;
  iVar4 = *(int *)(&DAT_00144c84 + uVar5 * 4);
  iVar1 = (&DAT_00144e84)[uVar5];
  N_00 = N;
  if (iVar4 < N) {
    do {
      if (iVar4 == 0) {
        puVar6 = (undefined8 *)0x0;
        puVar7 = (undefined8 *)0x0;
      }
      else {
        puVar7 = (undefined8 *)src->list_;
        puVar6 = puVar7;
        iVar2 = iVar4 + -1;
        if (1 < iVar4) {
          do {
            puVar6 = (undefined8 *)*puVar6;
            iVar2 = iVar2 + -1;
          } while (iVar2 != 0);
        }
        src->list_ = (void *)*puVar6;
        *puVar6 = 0;
      }
      uVar3 = src->length_ - iVar4;
      src->length_ = uVar3;
      if (uVar3 < src->lowater_) {
        src->lowater_ = uVar3;
      }
      CentralFreeList::InsertRange
                ((CentralFreeList *)(&Static::central_cache_ + uVar5 * 0x130),puVar7,puVar6,iVar4);
      N_00 = N_00 - iVar4;
    } while (iVar4 < (int)N_00);
  }
  if (N_00 == 0) {
    puVar6 = (undefined8 *)0x0;
    puVar7 = (undefined8 *)0x0;
  }
  else {
    puVar7 = (undefined8 *)src->list_;
    puVar6 = puVar7;
    if (1 < (int)N_00) {
      iVar4 = N_00 - 1;
      do {
        puVar6 = (undefined8 *)*puVar6;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    src->list_ = (void *)*puVar6;
    *puVar6 = 0;
  }
  uVar3 = src->length_ - N_00;
  src->length_ = uVar3;
  if (uVar3 < src->lowater_) {
    src->lowater_ = uVar3;
  }
  CentralFreeList::InsertRange
            ((CentralFreeList *)(&Static::central_cache_ + uVar5 * 0x130),puVar7,puVar6,N_00);
  this->size_ = this->size_ - N * iVar1;
  return;
}

Assistant:

void ThreadCache::ReleaseToCentralCache(FreeList* src, uint32_t cl, int N) {
  ASSERT(src == &list_[cl]);
  if (N > src->length()) N = src->length();
  size_t delta_bytes = N * Static::sizemap()->ByteSizeForClass(cl);

  // We return prepackaged chains of the correct size to the central cache.
  // TODO: Use the same format internally in the thread caches?
  int batch_size = Static::sizemap()->num_objects_to_move(cl);
  while (N > batch_size) {
    void *tail, *head;
    src->PopRange(batch_size, &head, &tail);
    Static::central_cache()[cl].InsertRange(head, tail, batch_size);
    N -= batch_size;
  }
  void *tail, *head;
  src->PopRange(N, &head, &tail);
  Static::central_cache()[cl].InsertRange(head, tail, N);
  size_ -= delta_bytes;
}